

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O0

double __thiscall BMRS<TTA>::Alloc(BMRS<TTA> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  PerformanceEvaluator *perf;
  double dVar4;
  double dVar5;
  double ma_t;
  double t;
  Size local_90;
  Mat_<int> local_88;
  int local_24;
  int local_20;
  int h_merge;
  int h;
  int w;
  double ls_t;
  BMRS<TTA> *this_local;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  _h = TTA::Alloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) *
                  ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1,perf);
  h_merge = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  local_20 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  local_24 = local_20 / 2 + local_20 % 2;
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_90);
  cv::Mat_<int>::Mat_(&local_88,&local_90);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_88)
  ;
  cv::Mat_<int>::~Mat_(&local_88);
  Data_Compressed::Alloc(&this->data_compressed,local_20,h_merge);
  Data_Compressed::Alloc(&this->data_merged,local_24,h_merge);
  Data_Compressed::Alloc(&this->data_flags,local_24 + -1,h_merge);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset((this->data_compressed).bits,0,
         (long)((this->data_compressed).height * (this->data_compressed).data_width) << 3);
  memset((this->data_merged).bits,0,
         (long)((this->data_merged).height * (this->data_merged).data_width) << 3);
  memset((this->data_flags).bits,0,
         (long)((this->data_flags).height * (this->data_flags).data_width) << 3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar4 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  Runs::Alloc(&this->data_runs,local_24,h_merge);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset((this->data_compressed).bits,0,
         (long)((this->data_compressed).height * (this->data_compressed).data_width) << 3);
  memset((this->data_merged).bits,0,
         (long)((this->data_merged).height * (this->data_merged).data_width) << 3);
  memset((this->data_flags).bits,0,
         (long)((this->data_flags).height * (this->data_flags).data_width) << 3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar5 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return _h + (dVar4 - dVar5);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        int w(img_.cols);
        int h(img_.rows);
        int h_merge = h / 2 + h % 2;

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(h, w);
        data_merged.Alloc(h_merge, w);
        data_flags.Alloc(h_merge - 1, w);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(h_merge, w);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }